

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O2

void soplex::
     LPFwriteSVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *p_lp,ostream *p_output,NameSet *p_cnames,
               SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *p_svec,bool writeZeroCoefficients)

{
  type_conflict5 tVar1;
  ostream *poVar2;
  ostream *poVar3;
  char *pcVar4;
  long lVar5;
  int iVar6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar7;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar8;
  int j;
  int i;
  byte bVar9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_148;
  char name [16];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  coeff;
  
  bVar9 = 0;
  iVar6 = 0;
  for (i = 0; i < (p_lp->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum; i = i + 1) {
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator[](&coeff,p_svec,i);
    local_148.m_backend.data._M_elems[0] = 0;
    tVar1 = boost::multiprecision::operator==(&coeff,(int *)&local_148);
    if (!tVar1 || writeZeroCoefficients) {
      if (iVar6 == 0) {
        poVar3 = boost::multiprecision::operator<<(p_output,&coeff);
      }
      else {
        if (iVar6 % 5 == 0) {
          std::operator<<(p_output,"\n\t");
        }
        local_148.m_backend.data._M_elems[0] = 0;
        tVar1 = boost::multiprecision::operator<(&coeff,(int *)&local_148);
        poVar3 = p_output;
        if (tVar1) {
          poVar2 = std::operator<<(p_output," - ");
          pnVar7 = &coeff;
          pnVar8 = &local_148;
          for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
            (pnVar8->m_backend).data._M_elems[0] = (pnVar7->m_backend).data._M_elems[0];
            pnVar7 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)((long)pnVar7 + ((ulong)bVar9 * -2 + 1) * 4);
            pnVar8 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)((long)pnVar8 + ((ulong)bVar9 * -2 + 1) * 4);
          }
          local_148.m_backend.exp = coeff.m_backend.exp;
          local_148.m_backend.neg = coeff.m_backend.neg;
          local_148.m_backend.fpclass = coeff.m_backend.fpclass;
          local_148.m_backend.prec_elem = coeff.m_backend.prec_elem;
          if (coeff.m_backend.fpclass != cpp_dec_float_finite ||
              local_148.m_backend.data._M_elems[0] != 0) {
            local_148.m_backend.neg = (bool)(coeff.m_backend.neg ^ 1);
          }
          boost::multiprecision::operator<<(poVar2,&local_148);
        }
        else {
          poVar2 = std::operator<<(p_output," + ");
          boost::multiprecision::operator<<(poVar2,&coeff);
        }
      }
      poVar3 = std::operator<<(poVar3," ");
      pcVar4 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         (p_lp,i,p_cnames,name);
      std::operator<<(poVar3,pcVar4);
      iVar6 = iVar6 + 1;
    }
  }
  return;
}

Assistant:

static void LPFwriteSVector(
   const SPxLPBase<R>&   p_lp,                         ///< the LP
   std::ostream&         p_output,                     ///< output stream
   const NameSet*        p_cnames,                     ///< column names
   const SVectorBase<R>& p_svec,                       ///< vector to write
   const bool            writeZeroCoefficients = false ///< write zero objective coefficients
)
{

   char name[16];
   int num_coeffs = 0;

   for(int j = 0; j < p_lp.nCols(); ++j)
   {
      const R coeff = p_svec[j];

      if(coeff == 0 && !writeZeroCoefficients)
         continue;

      if(num_coeffs == 0)
         p_output << coeff << " " << getColName(p_lp, j, p_cnames, name);
      else
      {
         // insert a line break every SOPLEX_NUM_ENTRIES_PER_LINE columns
         if(num_coeffs % SOPLEX_NUM_ENTRIES_PER_LINE == 0)
            p_output << "\n\t";

         if(coeff < 0)
            p_output << " - " << -coeff;
         else
            p_output << " + " << coeff;

         p_output << " " << getColName(p_lp, j, p_cnames, name);
      }

      ++num_coeffs;
   }
}